

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O3

void __thiscall
MT32Emu::LA32FloatWaveGenerator::initPCM
          (LA32FloatWaveGenerator *this,Bit16s *usePCMWaveAddress,Bit32u usePCMWaveLength,
          bool usePCMWaveLooped,bool usePCMWaveInterpolated)

{
  this->pcmWaveAddress = usePCMWaveAddress;
  this->pcmWaveLength = usePCMWaveLength;
  this->pcmWaveLooped = usePCMWaveLooped;
  this->pcmWaveInterpolated = usePCMWaveInterpolated;
  this->pcmPosition = 0.0;
  this->active = true;
  return;
}

Assistant:

void LA32FloatWaveGenerator::initPCM(const Bit16s * const usePCMWaveAddress, const Bit32u usePCMWaveLength, const bool usePCMWaveLooped, const bool usePCMWaveInterpolated) {
	pcmWaveAddress = usePCMWaveAddress;
	pcmWaveLength = usePCMWaveLength;
	pcmWaveLooped = usePCMWaveLooped;
	pcmWaveInterpolated = usePCMWaveInterpolated;

	pcmPosition = 0.0f;
	active = true;
}